

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr.c
# Opt level: O2

void add_action(Grammar *g,State *s,uint akind,Term *aterm,Rule *arule,State *astate)

{
  uint uVar1;
  Action *pAVar2;
  Action **ppAVar3;
  ulong uVar4;
  Action **ppAVar5;
  VecAction *v;
  
  if (akind == 2) {
    v = &s->reduce_actions;
    uVar4 = 0;
    do {
      if ((s->reduce_actions).n == uVar4) {
        pAVar2 = new_Action(g,2,aterm,arule,astate);
        ppAVar3 = (s->reduce_actions).v;
        ppAVar5 = (s->reduce_actions).e;
        if (ppAVar3 == (Action **)0x0) {
          (s->reduce_actions).v = ppAVar5;
          uVar1 = (s->reduce_actions).n;
          (s->reduce_actions).n = uVar1 + 1;
          (s->reduce_actions).e[uVar1] = pAVar2;
          return;
        }
        goto LAB_0014086a;
      }
      ppAVar5 = (s->reduce_actions).v + uVar4;
      uVar4 = uVar4 + 1;
    } while ((*ppAVar5)->rule != arule);
  }
  else {
    v = &s->shift_actions;
    for (uVar4 = 0; (s->shift_actions).n != uVar4; uVar4 = uVar4 + 1) {
      pAVar2 = (s->shift_actions).v[uVar4];
      if (((pAVar2->term == aterm) && (pAVar2->state == astate)) && (pAVar2->kind == ACTION_SHIFT))
      {
        return;
      }
    }
    pAVar2 = new_Action(g,1,aterm,arule,astate);
    ppAVar3 = (s->shift_actions).v;
    ppAVar5 = (s->shift_actions).e;
    if (ppAVar3 == (Action **)0x0) {
      (s->shift_actions).v = ppAVar5;
      uVar1 = (s->shift_actions).n;
      (s->shift_actions).n = uVar1 + 1;
      (s->shift_actions).e[uVar1] = pAVar2;
    }
    else {
LAB_0014086a:
      uVar1 = v->n;
      if (ppAVar3 == ppAVar5) {
        if (2 < uVar1) goto LAB_0014088e;
      }
      else if ((uVar1 & 7) == 0) {
LAB_0014088e:
        vec_add_internal(v,pAVar2);
        return;
      }
      v->n = uVar1 + 1;
      ppAVar3[uVar1] = pAVar2;
    }
  }
  return;
}

Assistant:

static void add_action(Grammar *g, State *s, uint akind, Term *aterm, Rule *arule, State *astate) {
  uint i;
  Action *a;

  if (akind == ACTION_REDUCE) {
    /* eliminate duplicates */
    for (i = 0; i < s->reduce_actions.n; i++)
      if (s->reduce_actions.v[i]->rule == arule) return;
    a = new_Action(g, akind, aterm, arule, astate);
    vec_add(&s->reduce_actions, a);
  } else {
    /* eliminate duplicates */
    for (i = 0; i < s->shift_actions.n; i++)
      if (s->shift_actions.v[i]->term == aterm && s->shift_actions.v[i]->state == astate &&
          s->shift_actions.v[i]->kind == akind)
        return;
    a = new_Action(g, akind, aterm, arule, astate);
    vec_add(&s->shift_actions, a);
  }
}